

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_server_main.cpp
# Opt level: O0

void __thiscall settings::setup(settings *this,value *v)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  session_file_storage_factory *psVar6;
  session_memory_storage_factory *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined8 uVar7;
  cppcms_error *this_01;
  char *in_RSI;
  string *in_RDI;
  cppcms_session_storage_generator_type f;
  string error;
  string entry_point;
  string module;
  string so;
  string dir;
  string stor;
  int items;
  string *in_stack_fffffffffffffc18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  allocator *paVar8;
  undefined7 in_stack_fffffffffffffc30;
  undefined1 in_stack_fffffffffffffc37;
  uint *in_stack_fffffffffffffc38;
  char *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc50;
  code *pcVar9;
  value *in_stack_fffffffffffffc58;
  shared_object *in_stack_fffffffffffffc60;
  char *in_stack_fffffffffffffc68;
  string *this_02;
  char *in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc80;
  value *in_stack_fffffffffffffc88;
  allocator local_2e9;
  string local_2e8 [39];
  undefined1 local_2c1;
  code *local_2a0;
  undefined1 local_291;
  string local_230 [32];
  string local_210 [38];
  undefined1 local_1ea;
  allocator local_1e9;
  string local_1e8 [38];
  undefined1 local_1c2;
  allocator local_1c1;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  string local_e8 [39];
  undefined1 local_c1;
  string local_c0 [32];
  string local_a0 [48];
  string local_70 [36];
  undefined4 local_4c;
  undefined1 local_48 [12];
  undefined4 local_3c;
  int local_38;
  undefined4 local_34;
  string local_30 [32];
  char *local_10;
  
  local_10 = in_RSI;
  cppcms::json::value::get_abi_cxx11_
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  std::__cxx11::string::operator=(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  iVar3 = cppcms::json::value::get<int>
                    ((value *)in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
  *(int *)(in_RDI + 0x20) = iVar3;
  local_34 = std::thread::hardware_concurrency();
  uVar4 = cppcms::json::value::get<unsigned_int>
                    ((value *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                     in_stack_fffffffffffffc38);
  *(uint *)(in_RDI + 0x24) = uVar4;
  local_3c = 0xffffffff;
  local_38 = cppcms::json::value::get<int>
                       ((value *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                        (int *)in_stack_fffffffffffffc38);
  if (local_38 != -1) {
    cppcms::impl::thread_cache_factory((uint)local_48);
    booster::intrusive_ptr<cppcms::impl::base_cache>::operator=
              ((intrusive_ptr<cppcms::impl::base_cache> *)
               CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
               (intrusive_ptr<cppcms::impl::base_cache> *)in_stack_fffffffffffffc28);
    booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr
              ((intrusive_ptr<cppcms::impl::base_cache> *)in_stack_fffffffffffffc20);
  }
  local_4c = 10;
  iVar3 = cppcms::json::value::get<int>
                    ((value *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                     (int *)in_stack_fffffffffffffc38);
  *(int *)(in_RDI + 0x28) = iVar3;
  cppcms::json::value::get_abi_cxx11_
            (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar1 = std::operator==(in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
    if (bVar1) {
      cppcms::json::value::get_abi_cxx11_
                (in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      psVar6 = (session_file_storage_factory *)operator_new(0x18);
      local_c1 = 1;
      std::__cxx11::string::string(local_c0,local_a0);
      cppcms::sessions::session_file_storage_factory::session_file_storage_factory
                (psVar6,local_c0,*(undefined4 *)(in_RDI + 0x24),1,0);
      local_c1 = 0;
      std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
      reset<cppcms::sessions::session_file_storage_factory>
                ((__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
                  *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                 (session_file_storage_factory *)in_stack_fffffffffffffc28);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_a0);
    }
    else {
      bVar1 = std::operator==(in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
      if (bVar1) {
        this_00 = (session_memory_storage_factory *)operator_new(0x18);
        cppcms::sessions::session_memory_storage_factory::session_memory_storage_factory(this_00);
        std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
        reset<cppcms::sessions::session_memory_storage_factory>
                  ((__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
                    *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                   (session_memory_storage_factory *)in_stack_fffffffffffffc28);
      }
      else {
        bVar1 = std::operator==(in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
        if (!bVar1) {
          local_2c1 = 1;
          uVar7 = __cxa_allocate_exception(0x30);
          std::operator+(in_stack_fffffffffffffc68,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc60);
          cppcms::cppcms_error::cppcms_error
                    ((cppcms_error *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          local_2c1 = 0;
          __cxa_throw(uVar7,&cppcms::cppcms_error::typeinfo,cppcms::cppcms_error::~cppcms_error);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_108,"",&local_109);
        cppcms::json::value::get<std::__cxx11::string>
                  (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
                   in_stack_fffffffffffffc48);
        std::__cxx11::string::~string(local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_150,"",&local_151);
        cppcms::json::value::get<std::__cxx11::string>
                  (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
                   in_stack_fffffffffffffc48);
        std::__cxx11::string::~string(local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_198,"sessions_generator",&local_199);
        cppcms::json::value::get<std::__cxx11::string>
                  (in_stack_fffffffffffffc58,(char *)in_stack_fffffffffffffc50,
                   in_stack_fffffffffffffc48);
        std::__cxx11::string::~string(local_198);
        std::allocator<char>::~allocator((allocator<char> *)&local_199);
        uVar5 = std::__cxx11::string::empty();
        if (((uVar5 & 1) != 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) != 0)) {
          local_1c2 = 1;
          uVar7 = __cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1c0,
                     "session.storage=external and neither session.shared_object nor session.module is defined"
                     ,&local_1c1);
          cppcms::cppcms_error::cppcms_error
                    ((cppcms_error *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          local_1c2 = 0;
          __cxa_throw(uVar7,&cppcms::cppcms_error::typeinfo,cppcms::cppcms_error::~cppcms_error);
        }
        uVar5 = std::__cxx11::string::empty();
        if (((uVar5 & 1) == 0) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
          local_1ea = 1;
          uVar7 = __cxa_allocate_exception(0x30);
          paVar8 = &local_1e9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1e8,"both session.shared_object and session.module are defined",paVar8);
          cppcms::cppcms_error::cppcms_error
                    ((cppcms_error *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          local_1ea = 0;
          __cxa_throw(uVar7,&cppcms::cppcms_error::typeinfo,cppcms::cppcms_error::~cppcms_error);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) != 0) {
          booster::shared_object::name(local_210);
          std::__cxx11::string::operator=(local_e8,local_210);
          std::__cxx11::string::~string(local_210);
        }
        this_02 = local_230;
        std::__cxx11::string::string(this_02);
        bVar2 = booster::shared_object::open(in_RDI + 0x48,local_e8);
        if ((bVar2 & 1) == 0) {
          local_291 = 1;
          __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __cxa_allocate_exception(0x30);
          std::operator+((char *)this_02,__rhs);
          std::operator+(in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20);
          std::operator+(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
          cppcms::cppcms_error::cppcms_error
                    ((cppcms_error *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          local_291 = 0;
          __cxa_throw(__rhs,&cppcms::cppcms_error::typeinfo,cppcms::cppcms_error::~cppcms_error);
        }
        local_2a0 = (code *)0x0;
        booster::shared_object::
        symbol<cppcms::sessions::session_storage_factory*(*)(cppcms::json::value_const&)>
                  (in_stack_fffffffffffffc60,
                   (_func_session_storage_factory_ptr_value_ptr **)in_stack_fffffffffffffc58,
                   in_stack_fffffffffffffc50);
        pcVar9 = local_2a0;
        uVar7 = cppcms::json::value::find(local_10);
        (*pcVar9)(uVar7);
        std::__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>::
        reset<cppcms::sessions::session_storage_factory>
                  ((__shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
                    *)CONCAT17(in_stack_fffffffffffffc37,in_stack_fffffffffffffc30),
                   (session_storage_factory *)in_stack_fffffffffffffc28);
        std::__cxx11::string::~string(local_230);
        std::__cxx11::string::~string(local_178);
        std::__cxx11::string::~string(local_130);
        std::__cxx11::string::~string(local_e8);
      }
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x38));
  if ((!bVar1) &&
     (bVar1 = booster::intrusive_ptr<cppcms::impl::base_cache>::operator!
                        ((intrusive_ptr<cppcms::impl::base_cache> *)(in_RDI + 0x50)), bVar1)) {
    this_01 = (cppcms_error *)__cxa_allocate_exception(0x30);
    paVar8 = &local_2e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2e8,"Neither cache.limit nor session.storage is defined",paVar8);
    cppcms::cppcms_error::cppcms_error(this_01,in_stack_fffffffffffffc18);
    __cxa_throw(this_01,&cppcms::cppcms_error::typeinfo,cppcms::cppcms_error::~cppcms_error);
  }
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void setup(cppcms::json::value const &v)
	{		
		ip=v.get("ip","0.0.0.0");
		port=v.get<int>("port");
		threads=v.get("threads",booster::thread::hardware_concurrency());
		int items = v.get("cache.limit",-1);
		if(items!=-1){
			cache = cppcms::impl::thread_cache_factory(items);
		}
		gc=v.get("session.gc",10);
		std::string stor = v.get("session.storage","");
		if(!stor.empty()) {
			#ifndef CPPCMS_NO_GZIP
			if(stor == "files") {
				std::string dir = v.get("session.dir","");
				#ifdef CPPCMS_WIN_NATIVE
				sessions.reset(new cppcms::sessions::session_file_storage_factory(dir));
				#else
				sessions.reset(new cppcms::sessions::session_file_storage_factory(dir,threads,1,false));
				#endif
			}
			else 
			#endif //CPPCMS_NO_GZIP
            if(stor == "memory") {
				sessions.reset(new cppcms::sessions::session_memory_storage_factory());
			}
			else if(stor == "external") {
				std::string so = v.get<std::string>("session.shared_object","");
				std::string module = v.get<std::string>("session.module","");
				std::string entry_point = v.get<std::string>("session.entry_point","sessions_generator");
				if(so.empty() && module.empty())
					throw cppcms::cppcms_error(
								"session.storage=external "
								"and neither session.shared_object "
								"nor session.module is defined");
				if(!so.empty() && !module.empty())
					throw cppcms::cppcms_error(
								"both session.shared_object "
								"and session.module are defined");

				if(so.empty()) {
					so = booster::shared_object::name(module);
				}
				std::string error;
				if(!plugin.open(so,error)) {
					throw cppcms::cppcms_error("sessions_pool: failed to load shared object " + so + ": " + error);
				}
				cppcms::sessions::cppcms_session_storage_generator_type f=0;
				plugin.symbol(f,entry_point);
				sessions.reset(f(v.find("session.settings")));
			}
			else 
				throw cppcms::cppcms_error("Unknown session.storage:"+stor);
		}
		if(!sessions && !cache) {
			throw cppcms::cppcms_error("Neither cache.limit nor session.storage is defined");
		}
	}